

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec_asn1.cc
# Opt level: O1

int eckey_pub_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  EC_GROUP *group;
  EC_KEY *key_00;
  int iVar2;
  
  group = EC_KEY_parse_curve_name(params);
  if ((group == (EC_GROUP *)0x0) || (params->len != 0)) {
    iVar2 = 0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec_asn1.cc"
                  ,0x39);
  }
  else {
    key_00 = (EC_KEY *)EC_KEY_new();
    iVar2 = 0;
    if (key_00 != (EC_KEY *)0x0) {
      iVar1 = EC_KEY_set_group((EC_KEY *)key_00,(EC_GROUP *)group);
      if (iVar1 != 0) {
        iVar2 = 0;
        iVar1 = EC_KEY_oct2key(key_00,key->data,key->len,(BN_CTX *)0x0);
        if (iVar1 != 0) {
          evp_pkey_set_method(out,&ec_asn1_meth);
          out->pkey = key_00;
          iVar2 = 1;
          key_00 = (EC_KEY *)0x0;
        }
      }
    }
    if (key_00 != (EC_KEY *)0x0) {
      EC_KEY_free((EC_KEY *)key_00);
    }
  }
  return iVar2;
}

Assistant:

static int eckey_pub_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See RFC 5480, section 2.

  // The parameters are a named curve.
  const EC_GROUP *group = EC_KEY_parse_curve_name(params);
  if (group == NULL || CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  bssl::UniquePtr<EC_KEY> eckey(EC_KEY_new());
  if (eckey == nullptr ||  //
      !EC_KEY_set_group(eckey.get(), group) ||
      !EC_KEY_oct2key(eckey.get(), CBS_data(key), CBS_len(key), nullptr)) {
    return 0;
  }

  EVP_PKEY_assign_EC_KEY(out, eckey.release());
  return 1;
}